

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

int find_insn_pattern(gen_ctx_t gen_ctx,MIR_insn_t insn,int *size)

{
  byte *pbVar1;
  longdouble lVar2;
  int iVar3;
  VARR_insn_pattern_info_t *pVVar4;
  insn_pattern_info_t iVar5;
  VARR_int *pVVar6;
  VARR_uint8_t *pVVar7;
  long lVar8;
  float fVar9;
  MIR_reg_t MVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  int64_t iVar15;
  byte bVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  MIR_op_t *op;
  byte bVar20;
  ulong uVar21;
  byte bVar22;
  byte bVar23;
  byte *pbVar24;
  byte *pbVar25;
  bool bVar26;
  bool bVar27;
  undefined8 local_78;
  
  pVVar4 = gen_ctx->target_ctx->insn_pattern_info;
  if (((pVVar4 == (VARR_insn_pattern_info_t *)0x0) || (pVVar4->varr == (insn_pattern_info_t *)0x0))
     || (pVVar4->els_num <= (ulong)*(uint *)&insn->field_0x18)) {
    find_insn_pattern_cold_3();
LAB_0016c9bb:
    find_insn_pattern_cold_2();
LAB_0016c9c0:
    __assert_fail("nop < nops",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x788,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
  }
  iVar5 = pVVar4->varr[*(uint *)&insn->field_0x18];
  if (iVar5.num < 1) {
    return -1;
  }
  uVar21 = 0;
LAB_0016c187:
  pVVar6 = gen_ctx->target_ctx->pattern_indexes;
  if (((pVVar6 != (VARR_int *)0x0) && (pVVar6->varr != (int *)0x0)) &&
     (uVar19 = uVar21 + (long)iVar5.start, uVar19 < pVVar6->els_num)) {
    iVar3 = pVVar6->varr[uVar19];
    sVar12 = MIR_insn_nops(gen_ctx->ctx,insn);
    pbVar24 = (byte *)patterns[iVar3].pattern;
    if (*pbVar24 == 0) {
      uVar19 = 0;
LAB_0016c987:
      if (uVar19 != sVar12) {
        __assert_fail("nop == nops",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x831,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
LAB_0016c990:
      if (size == (int *)0x0) {
        return iVar3;
      }
      *size = patterns[iVar3].max_insn_size;
      return iVar3;
    }
    uVar19 = 0;
LAB_0016c1f7:
    for (; (bVar20 = *pbVar24, bVar20 == 9 || (bVar20 == 0x20)); pbVar24 = pbVar24 + 1) {
    }
    if (bVar20 == 0x24) goto LAB_0016c990;
    if (sVar12 <= uVar19 && 0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) goto LAB_0016c958;
    if (uVar19 == sVar12) goto LAB_0016c9c0;
    lVar13 = (long)(char)bVar20;
    op = insn->ops + uVar19;
    pbVar25 = pbVar24;
    if (bVar20 < 0x58) {
      if (9 < bVar20 - 0x30) {
        if (bVar20 != 0x4c) goto switchD_0016c277_caseD_6a;
        goto LAB_0016c93a;
      }
      if (uVar19 <= lVar13 - 0x30U) {
        __assert_fail("n < nop",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x80f,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      lVar8 = lVar13 * 0x30;
      bVar20 = *(byte *)((long)insn + lVar8 + -0x8d8);
      lVar2 = *(longdouble *)((long)insn + lVar8 + -0x8d0);
      bVar16 = op->field_0x8;
      bVar18 = bVar16;
      if (bVar16 == 4) {
        bVar18 = 3;
      }
      if ((bVar20 != bVar18) && ((bVar20 != 4 || (bVar18 != 3)))) goto LAB_0016c958;
      local_78._0_4_ = SUB104(lVar2,0);
      fVar9 = (float)local_78;
      local_78 = SUB108(lVar2,0);
      if ((bVar18 & 0xfe) != 2) {
        switch(bVar18) {
        case 5:
          goto switchD_0016c37b_caseD_5;
        case 6:
          goto switchD_0016c37b_caseD_6;
        case 7:
          goto switchD_0016c37b_caseD_7;
        default:
          __assert_fail("mode == MIR_OP_VAR || mode == MIR_OP_INT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE || mode == MIR_OP_VAR_MEM || mode == MIR_OP_LABEL"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x817,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        case 0xb:
          goto switchD_0016c37b_caseD_b;
        case 0xc:
          goto switchD_0016c37b_caseD_c;
        }
      }
      switch(bVar18) {
      case 2:
        if ((float)(op->u).reg != fVar9) goto LAB_0016c958;
        switch(bVar18) {
        case 3:
          goto switchD_0016c37b_caseD_3;
        case 5:
          goto switchD_0016c37b_caseD_5;
        case 6:
          goto switchD_0016c37b_caseD_6;
        case 7:
          goto switchD_0016c37b_caseD_7;
        case 0xb:
          goto switchD_0016c37b_caseD_b;
        case 0xc:
          goto switchD_0016c37b_caseD_c;
        }
        break;
      case 3:
switchD_0016c37b_caseD_3:
        if ((double)(op->u).i != local_78) goto LAB_0016c958;
        switch(bVar16) {
        case 5:
          goto switchD_0016c37b_caseD_5;
        case 6:
          goto switchD_0016c37b_caseD_6;
        case 7:
          goto switchD_0016c37b_caseD_7;
        case 0xb:
          goto switchD_0016c37b_caseD_b;
        case 0xc:
          goto switchD_0016c37b_caseD_c;
        }
        break;
      case 5:
switchD_0016c37b_caseD_5:
        if (((op->u).f != fVar9) || (NAN((op->u).f) || NAN(fVar9))) goto LAB_0016c958;
        switch(bVar16) {
        case 6:
          goto switchD_0016c37b_caseD_6;
        case 7:
          goto switchD_0016c37b_caseD_7;
        case 0xb:
          goto switchD_0016c37b_caseD_b;
        case 0xc:
          goto switchD_0016c37b_caseD_c;
        }
        break;
      case 6:
switchD_0016c37b_caseD_6:
        if (((op->u).d != local_78) || (NAN((op->u).d) || NAN(local_78))) goto LAB_0016c958;
        if (bVar16 == 0xc) goto switchD_0016c37b_caseD_c;
        if (bVar16 == 0xb) goto switchD_0016c37b_caseD_b;
        if (bVar16 == 7) goto switchD_0016c37b_caseD_7;
        break;
      case 7:
switchD_0016c37b_caseD_7:
        if (((op->u).ld != lVar2) || (NAN((op->u).ld) || NAN(lVar2))) goto LAB_0016c958;
        if (bVar16 == 0xb) goto switchD_0016c37b_caseD_b;
        if (bVar16 == 0xc) goto switchD_0016c37b_caseD_c;
        break;
      case 0xb:
        goto switchD_0016c37b_caseD_b;
      case 0xc:
switchD_0016c37b_caseD_c:
        if ((double)(op->u).i != local_78) goto LAB_0016c958;
        if (bVar18 == 0xb) goto switchD_0016c37b_caseD_b;
      }
      goto LAB_0016c93a;
    }
    switch(bVar20) {
    case 0x68:
      if (op->field_0x8 != '\x02') goto LAB_0016c958;
      bVar20 = pbVar24[1];
      if (9 < (byte)(bVar20 - 0x30)) {
LAB_0016caa0:
        __assert_fail("\'0\' <= ch && ch <= \'9\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x798,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      pbVar25 = pbVar24 + 1;
      pbVar1 = pbVar24 + 2;
      MVar10 = (char)*pbVar1 + -0x210 + ((uint)bVar20 + (uint)bVar20 * 4) * 2;
      pbVar24 = pbVar24 + 2;
      if (9 < (byte)(*pbVar1 - 0x30)) {
        MVar10 = bVar20 - 0x30;
        pbVar24 = pbVar25;
      }
      bVar27 = (op->u).reg == MVar10;
      break;
    case 0x69:
      if (((byte)op->field_0x8 < 9) && ((0x118U >> ((byte)op->field_0x8 & 0x1f) & 1) != 0)) {
        bVar20 = pbVar24[1];
        if ((bVar20 & 0xfc) != 0x30) {
          __assert_fail("\'0\' <= ch && ch <= \'3\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7a9,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        pbVar25 = pbVar24 + 1;
        iVar15 = int_value(gen_ctx,op);
        if (bVar20 == 0x32) {
LAB_0016c930:
          lVar13 = (long)(int)iVar15;
          pbVar24 = pbVar25;
          goto LAB_0016c933;
        }
        if (bVar20 == 0x31) {
          lVar13 = (long)(short)iVar15;
        }
        else {
          if (bVar20 != 0x30) goto LAB_0016c93a;
          lVar13 = (long)(char)iVar15;
        }
        if (lVar13 == iVar15) goto LAB_0016c93a;
      }
      goto LAB_0016c958;
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
switchD_0016c277_caseD_6a:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x82e,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    case 0x6c:
      if ((size != (int *)0x0) || (op->field_0x8 != '\f')) goto LAB_0016c958;
      sVar14 = get_label_disp(gen_ctx,(MIR_insn_t)(op->u).ref);
      pVVar7 = gen_ctx->target_ctx->result_code;
      if (pVVar7 == (VARR_uint8_t *)0x0) {
        find_insn_pattern_cold_1();
        goto LAB_0016caa0;
      }
      lVar13 = sVar14 - pVVar7->els_num;
      if (lVar13 < 0) {
        iVar15 = (lVar13 - patterns[iVar3].max_insn_size) + -4;
      }
      else {
        iVar15 = lVar13 + -2;
      }
      lVar13 = (long)(char)iVar15;
LAB_0016c933:
      bVar27 = lVar13 == iVar15;
      break;
    case 0x6d:
      pbVar25 = pbVar24 + 1;
      bVar20 = pbVar24[1];
      bVar16 = 0x13;
      bVar27 = true;
      if (bVar20 < 0x6c) {
        if (bVar20 == 100) {
          bVar22 = 0x13;
          bVar18 = 9;
        }
        else {
          bVar26 = true;
          bVar22 = 0x13;
          bVar18 = 8;
          if (bVar20 != 0x66) goto LAB_0016c705;
        }
      }
      else if (bVar20 == 0x6c) {
        if (pbVar24[2] != 100) {
          __assert_fail("ch == \'d\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7cd,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        pbVar25 = pbVar24 + 2;
        bVar22 = 0x13;
        bVar18 = 10;
      }
      else {
        if ((bVar20 == 0x73) || (bVar20 == 0x75)) {
          bVar27 = bVar20 == 0x75;
          bVar26 = bVar20 == 0x73;
          bVar20 = pbVar24[2];
          pbVar25 = pbVar24 + 2;
        }
        else {
          bVar26 = true;
        }
LAB_0016c705:
        if ((bVar20 & 0xfc) != 0x30) {
          __assert_fail("\'0\' <= ch && ch <= \'3\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7d8,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        bVar23 = bVar26 & bVar27;
        if (bVar20 == 0x32) {
          bVar18 = bVar27 | 4;
          bVar20 = 4;
        }
        else {
          if (bVar20 != 0x31) {
            if (bVar20 == 0x30) {
              bVar22 = 0x13;
              bVar16 = 0x13;
              bVar18 = bVar27;
              if (bVar23 != 0) {
                bVar16 = 0;
              }
            }
            else {
              bVar16 = 0x13;
              if (bVar23 != 0) {
                bVar16 = 6;
              }
              bVar22 = 0xb;
              bVar18 = bVar27 | 6;
            }
            goto LAB_0016c8cb;
          }
          bVar18 = bVar27 | 2;
          bVar20 = 2;
        }
        bVar22 = 0x13;
        bVar16 = 0x13;
        if (bVar23 != 0) {
          bVar16 = bVar20;
        }
      }
LAB_0016c8cb:
      if (((bVar18 == 10) && (op->field_0x8 == '\x02')) && (0x21 < (op->u).reg)) goto LAB_0016c93a;
      if ((op->field_0x8 == '\v') &&
         ((((bVar20 = *(byte *)&op->u, bVar22 == bVar20 || (bVar18 == bVar20)) || (bVar16 == bVar20)
           ) && (((op->u).mem.index == 0xffffffff ||
                 ((uVar11 = (uint)(op->u).mem.scale, uVar11 < 9 &&
                  ((0x116U >> (uVar11 & 0x1f) & 1) != 0)))))))) {
        iVar15 = (op->u).mem.disp;
        goto LAB_0016c930;
      }
      goto LAB_0016c958;
    case 0x72:
      bVar27 = op->field_0x8 == '\x02';
      break;
    case 0x73:
      if ((1 < (ushort)((byte)op->field_0x8 - 3)) || (8 < (op->u).u)) goto LAB_0016c958;
      bVar27 = (0x116UL >> ((op->u).u & 0x3f) & 1) != 0;
      break;
    case 0x74:
      if (op->field_0x8 != '\x02') goto LAB_0016c958;
      bVar27 = (op->u).reg < 4;
      break;
    case 0x7a:
      if (1 < (ushort)((byte)op->field_0x8 - 3)) goto LAB_0016c958;
      bVar27 = (op->u).i == 0;
      break;
    default:
      if (bVar20 == 0x58) goto LAB_0016c93a;
      if (bVar20 != 99) goto switchD_0016c277_caseD_6a;
      lVar13 = 1;
      uVar17 = 0;
      bVar20 = pbVar24[1];
      while ((int)(char)bVar20 - 0x30U < 10) {
        if (uVar17 >> 0x3c != 0) {
          __assert_fail("(res >> 60) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x744,"uint64_t read_dec(const char **)");
        }
        uVar17 = (ulong)((int)(char)bVar20 - 0x30U) + uVar17 * 10;
        lVar8 = lVar13 + 1;
        lVar13 = lVar13 + 1;
        bVar20 = pbVar24[lVar8];
      }
      if (lVar13 == 1) {
        __assert_fail("p != *ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x747,"uint64_t read_dec(const char **)");
      }
      if ((1 < (ushort)((byte)op->field_0x8 - 3)) || ((op->u).i != uVar17)) goto LAB_0016c958;
      pbVar25 = pbVar24 + lVar13 + -1;
      goto LAB_0016c93a;
    }
joined_r0x0016c7e6:
    pbVar25 = pbVar24;
    if (!bVar27) goto LAB_0016c958;
    goto LAB_0016c93a;
  }
  goto LAB_0016c9bb;
switchD_0016c37b_caseD_b:
  local_78._0_1_ = SUB101(lVar2,0);
  if ((((*(char *)&op->u != (char)local_78) ||
       ((op->u).mem.disp != *(long *)((long)insn + lVar8 + -0x8b8))) ||
      ((op->u).mem.base != insn[-0x1c].ops[lVar13 + -1].u.reg)) ||
     (MVar10 = (op->u).mem.index, MVar10 != *(MIR_reg_t *)((long)insn + lVar8 + -0x8bc)))
  goto LAB_0016c958;
  if (MVar10 != 0xffffffff) {
    local_78._1_1_ = (MIR_scale_t)((unkuint10)lVar2 >> 8);
    bVar27 = (op->u).mem.scale == local_78._1_1_;
    goto joined_r0x0016c7e6;
  }
LAB_0016c93a:
  pbVar24 = pbVar25 + 1;
  uVar19 = uVar19 + 1;
  if (pbVar25[1] == 0) goto LAB_0016c987;
  goto LAB_0016c1f7;
LAB_0016c958:
  uVar21 = uVar21 + 1;
  if (uVar21 == (ulong)iVar5 >> 0x20) {
    return -1;
  }
  goto LAB_0016c187;
}

Assistant:

static int find_insn_pattern (gen_ctx_t gen_ctx, MIR_insn_t insn, int *size) {
  int i, ind;
  const struct pattern *pat;
  insn_pattern_info_t info = VARR_GET (insn_pattern_info_t, insn_pattern_info, insn->code);

  for (i = 0; i < info.num; i++) {
    ind = VARR_GET (int, pattern_indexes, info.start + i);
    pat = &patterns[ind];
    if (pattern_match_p (gen_ctx, pat, insn, size == NULL)) {
      if (size != NULL) *size = patterns[ind].max_insn_size;
      return ind;
    }
  }
  return -1;
}